

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void R_ProjectParticle(particle_t *particle,sector_t *sector,int shade,int fakeside)

{
  int iVar1;
  secplane_t *this;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  fixed_t fVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  TVector3<float> local_104;
  TVector2<double> local_f8;
  TVector2<double> local_e8;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  FTextureID local_b8;
  FTextureID local_b4;
  FTextureID botpic;
  FTextureID toppic;
  secplane_t *botplane;
  secplane_t *topplane;
  double psize;
  BYTE *local_88;
  BYTE *map;
  sector_t *heightsec;
  vissprite_t *vis;
  int y2;
  int y1;
  int x2;
  int x1;
  double yscale;
  double xscale;
  double tiz;
  double tz;
  double ty;
  double tx;
  double tr_y;
  double tr_x;
  int fakeside_local;
  int shade_local;
  sector_t *sector_local;
  particle_t *particle_local;
  
  map = (BYTE *)0x0;
  bVar6 = false;
  tr_x._0_4_ = fakeside;
  tr_x._4_4_ = shade;
  _fakeside_local = sector;
  sector_local = (sector_t *)particle;
  if (CurrentPortal != (PortalDrawseg *)0x0) {
    TVector2<double>::TVector2((TVector2<double> *)&psize,&particle->Pos);
    iVar3 = P_PointOnLineSide((DVector2 *)&psize,CurrentPortal->dst);
    bVar6 = iVar3 != 0;
  }
  iVar1 = centerx;
  iVar3 = WindowLeft;
  if (!bVar6) {
    tr_y = sector_local->planes[0].xform.xOffs - ViewPos.X;
    tx = sector_local->planes[0].xform.yOffs - ViewPos.Y;
    tiz = tr_y * ViewTanCos + tx * ViewTanSin;
    if (0.0078125 <= tiz) {
      ty = tr_y * ViewSin - tx * ViewCos;
      if ((MirrorFlags & 1) != 0) {
        ty = ((double)viewwidth - ty) - 1.0;
      }
      if (ABS(ty) < tiz) {
        xscale = 1.0 / tiz;
        yscale = (double)centerx * xscale;
        dVar7 = sector_local->planes[0].TexZ / 8.0;
        iVar4 = xs_RoundToInt((real64)((ty - dVar7) * yscale));
        y1 = MAX<int>(iVar3,iVar1 + iVar4);
        iVar1 = centerx;
        iVar3 = WindowRight;
        iVar4 = xs_RoundToInt((real64)((ty + dVar7) * yscale));
        y2 = MIN<int>(iVar3,iVar1 + iVar4);
        if (y1 < y2) {
          _x2 = YaspectMul * yscale;
          tz = sector_local->planes[0].xform.baseyOffs - ViewPos.Z;
          vis._4_4_ = xs_RoundToInt((real64)(CenterY - (tz + dVar7) * _x2));
          vis._0_4_ = xs_RoundToInt((real64)(CenterY - (tz - dVar7) * _x2));
          if (vis._4_4_ < ceilingclip[y1]) {
            vis._4_4_ = (int32_t)ceilingclip[y1];
          }
          if (vis._4_4_ < ceilingclip[y2 + -1]) {
            vis._4_4_ = (int32_t)ceilingclip[y2 + -1];
          }
          if (floorclip[y1] <= (int)vis) {
            vis._0_4_ = floorclip[y1] + -1;
          }
          if (floorclip[y2 + -1] <= (int)vis) {
            vis._0_4_ = floorclip[y2 + -1] + -1;
          }
          if (vis._4_4_ <= (int)vis) {
            map = (BYTE *)sector_t::GetHeightSec(_fakeside_local);
            FTextureID::FTextureID(&local_b4);
            FTextureID::FTextureID(&local_b8);
            if (map == (BYTE *)0x0) {
              botplane = &_fakeside_local->ceilingplane;
              _botpic = &_fakeside_local->floorplane;
              local_d4 = (int)sector_t::GetTexture(_fakeside_local,1);
              local_b4 = (FTextureID)local_d4;
              local_d8 = (int)sector_t::GetTexture(_fakeside_local,0);
              local_88 = _fakeside_local->ColorMap->Maps;
              local_b8 = (FTextureID)local_d8;
            }
            else if (tr_x._0_4_ == 2) {
              botplane = &_fakeside_local->ceilingplane;
              _botpic = (secplane_t *)(map + 0xd8);
              local_bc = (int)sector_t::GetTexture(_fakeside_local,1);
              local_b4 = (FTextureID)local_bc;
              local_c0 = (int)sector_t::GetTexture((sector_t *)map,1);
              local_88 = (BYTE *)**(long **)(map + 0x100);
              local_b8 = (FTextureID)local_c0;
            }
            else if (tr_x._0_4_ == 1) {
              botplane = (secplane_t *)(map + 0xb0);
              _botpic = &_fakeside_local->floorplane;
              local_c4 = (int)sector_t::GetTexture((sector_t *)map,0);
              local_b4 = (FTextureID)local_c4;
              local_c8 = (int)sector_t::GetTexture(_fakeside_local,0);
              local_88 = (BYTE *)**(long **)(map + 0x100);
              local_b8 = (FTextureID)local_c8;
            }
            else {
              botplane = (secplane_t *)(map + 0xd8);
              _botpic = (secplane_t *)(map + 0xb0);
              local_cc = (int)sector_t::GetTexture((sector_t *)map,1);
              local_b4 = (FTextureID)local_cc;
              local_d0 = (int)sector_t::GetTexture((sector_t *)map,0);
              local_88 = _fakeside_local->ColorMap->Maps;
              local_b8 = (FTextureID)local_d0;
            }
            bVar2 = FTextureID::operator!=(&local_b8,&skyflatnum);
            this = _botpic;
            bVar6 = false;
            if (bVar2) {
              dVar7 = sector_local->planes[0].xform.baseyOffs;
              TVector2<double>::TVector2(&local_e8,(TVector3<double> *)sector_local);
              dVar8 = secplane_t::ZatPoint(this,&local_e8);
              bVar6 = dVar7 < dVar8;
            }
            if (!bVar6) {
              bVar2 = FTextureID::operator!=(&local_b4,&skyflatnum);
              bVar6 = false;
              if (bVar2) {
                dVar7 = sector_local->planes[0].xform.baseyOffs;
                TVector2<double>::TVector2(&local_f8,(TVector3<double> *)sector_local);
                dVar8 = secplane_t::ZatPoint(botplane,&local_f8);
                bVar6 = dVar8 <= dVar7;
              }
              if (!bVar6) {
                heightsec = (sector_t *)R_NewVisSprite();
                *(int *)&(heightsec->floorplane).normal.X = CurrentPortalUniq;
                heightsec->planes[1].xform.xScale = (double)map;
                fVar5 = FloatToFixed(yscale);
                *(fixed_t *)&heightsec->planes[0].xform.yScale = fVar5;
                *(float *)((long)&heightsec->planes[0].xform.yScale + 4) = (float)yscale;
                *(float *)&heightsec->planes[0].xform.Angle.Degrees = (float)tiz;
                *(float *)((long)&heightsec->planes[0].xform.Angle.Degrees + 4) = (float)(1.0 / tiz)
                ;
                TVector3<float>::TVector3
                          (&local_104,(float)sector_local->planes[0].xform.xOffs,
                           (float)sector_local->planes[0].xform.yOffs,
                           (float)sector_local->planes[0].xform.baseyOffs);
                TVector3<float>::operator=
                          ((TVector3<float> *)((long)&heightsec->planes[0].xform.xOffs + 4),
                           &local_104);
                iVar3 = tr_x._4_4_;
                *(int32_t *)&heightsec->planes[0].xform.baseyOffs = vis._4_4_;
                *(int *)((long)&heightsec->planes[0].xform.baseyOffs + 4) = (int)vis;
                *(short *)&heightsec->planes[0].xform.xOffs = (short)y1;
                *(short *)((long)&heightsec->planes[0].xform.xOffs + 2) = (short)y2;
                *(undefined4 *)&heightsec->planes[1].alpha = 0;
                *(uint *)&heightsec->planes[1].xform.xOffs =
                     *(int *)((long)&sector_local->planes[1].xform.yOffs + 4) >> 0x18 & 0xff;
                *(undefined8 *)&heightsec->planes[0].Texture = 0;
                *(byte *)&heightsec->planes[1].Flags = (byte)heightsec->planes[1].Flags & 0xfe;
                *(ushort *)&heightsec->planes[1].Light =
                     (ushort)*(byte *)((long)&sector_local->planes[0].Texture.texnum + 1);
                *(char *)((long)&heightsec->planes[1].Flags + 1) = (char)tr_x._0_4_;
                heightsec->planes[0].alpha = 0.0;
                *(undefined1 *)((long)&heightsec->planes[1].Flags + 2) = 0;
                if (fixedlightlev < 0) {
                  if (fixedcolormap == (lighttable_t *)0x0) {
                    if (*(char *)&sector_local->planes[1].xform.yOffs == '\0') {
                      dVar7 = MIN<double>(24.0,xscale * r_SpriteVisibility * 0.5);
                      fVar5 = FloatToFixed(dVar7);
                      iVar3 = clamp<int>(iVar3 - fVar5 >> 0x10,0,0x1f);
                      *(char *)((long)&heightsec->planes[1].Flags + 2) = (char)iVar3;
                      *(BYTE **)&heightsec->planes[1].Texture =
                           local_88 +
                           (int)((uint)*(byte *)((long)&heightsec->planes[1].Flags + 2) << 8);
                    }
                    else {
                      *(BYTE **)&heightsec->planes[1].Texture = local_88;
                    }
                  }
                  else {
                    *(lighttable_t **)&heightsec->planes[1].Texture = fixedcolormap;
                  }
                }
                else {
                  *(BYTE **)&heightsec->planes[1].Texture = local_88 + fixedlightlev;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void R_ProjectParticle (particle_t *particle, const sector_t *sector, int shade, int fakeside)
{
	double 				tr_x, tr_y;
	double 				tx, ty;
	double	 			tz, tiz;
	double	 			xscale, yscale;
	int 				x1, x2, y1, y2;
	vissprite_t*		vis;
	sector_t*			heightsec = NULL;
	BYTE*				map;

	// [ZZ] Particle not visible through the portal plane
	if (CurrentPortal && !!P_PointOnLineSide(particle->Pos, CurrentPortal->dst))
		return;

	// transform the origin point
	tr_x = particle->Pos.X - ViewPos.X;
	tr_y = particle->Pos.Y - ViewPos.Y;

	tz = tr_x * ViewTanCos + tr_y * ViewTanSin;

	// particle is behind view plane?
	if (tz < MINZ)
		return;

	tx = tr_x * ViewSin - tr_y * ViewCos;

	// Flip for mirrors
	if (MirrorFlags & RF_XFLIP)
	{
		tx = viewwidth - tx - 1;
	}

	// too far off the side?
	if (tz <= fabs(tx))
		return;

	tiz = 1 / tz;
	xscale = centerx * tiz;

	// calculate edges of the shape
	double psize = particle->size / 8.0;

	x1 = MAX<int>(WindowLeft, centerx + xs_RoundToInt((tx - psize) * xscale));
	x2 = MIN<int>(WindowRight, centerx + xs_RoundToInt((tx + psize) * xscale));

	if (x1 >= x2)
		return;

	yscale = YaspectMul * xscale;
	ty = particle->Pos.Z - ViewPos.Z;
	y1 = xs_RoundToInt(CenterY - (ty + psize) * yscale);
	y2 = xs_RoundToInt(CenterY - (ty - psize) * yscale);

	// Clip the particle now. Because it's a point and projected as its subsector is
	// entered, we don't need to clip it to drawsegs like a normal sprite.

	// Clip particles behind walls.
	if (y1 <  ceilingclip[x1])		y1 = ceilingclip[x1];
	if (y1 <  ceilingclip[x2-1])	y1 = ceilingclip[x2-1];
	if (y2 >= floorclip[x1])		y2 = floorclip[x1] - 1;
	if (y2 >= floorclip[x2-1])		y2 = floorclip[x2-1] - 1;

	if (y1 > y2)
		return;

	// Clip particles above the ceiling or below the floor.
	heightsec = sector->GetHeightSec();

	const secplane_t *topplane;
	const secplane_t *botplane;
	FTextureID toppic;
	FTextureID botpic;

	if (heightsec)	// only clip things which are in special sectors
	{
		if (fakeside == FAKED_AboveCeiling)
		{
			topplane = &sector->ceilingplane;
			botplane = &heightsec->ceilingplane;
			toppic = sector->GetTexture(sector_t::ceiling);
			botpic = heightsec->GetTexture(sector_t::ceiling);
			map = heightsec->ColorMap->Maps;
		}
		else if (fakeside == FAKED_BelowFloor)
		{
			topplane = &heightsec->floorplane;
			botplane = &sector->floorplane;
			toppic = heightsec->GetTexture(sector_t::floor);
			botpic = sector->GetTexture(sector_t::floor);
			map = heightsec->ColorMap->Maps;
		}
		else
		{
			topplane = &heightsec->ceilingplane;
			botplane = &heightsec->floorplane;
			toppic = heightsec->GetTexture(sector_t::ceiling);
			botpic = heightsec->GetTexture(sector_t::floor);
			map = sector->ColorMap->Maps;
		}
	}
	else
	{
		topplane = &sector->ceilingplane;
		botplane = &sector->floorplane;
		toppic = sector->GetTexture(sector_t::ceiling);
		botpic = sector->GetTexture(sector_t::floor);
		map = sector->ColorMap->Maps;
	}

	if (botpic != skyflatnum && particle->Pos.Z < botplane->ZatPoint (particle->Pos))
		return;
	if (toppic != skyflatnum && particle->Pos.Z >= topplane->ZatPoint (particle->Pos))
		return;

	// store information in a vissprite
	vis = R_NewVisSprite ();
	vis->CurrentPortalUniq = CurrentPortalUniq;
	vis->heightsec = heightsec;
	vis->xscale = FLOAT2FIXED(xscale);
	vis->yscale = (float)xscale;
//	vis->yscale *= InvZtoScale;
	vis->depth = (float)tz;
	vis->idepth = float(1 / tz);
	vis->gpos = { (float)particle->Pos.X, (float)particle->Pos.Y, (float)particle->Pos.Z };
	vis->y1 = y1;
	vis->y2 = y2;
	vis->x1 = x1;
	vis->x2 = x2;
	vis->Translation = 0;
	vis->startfrac = 255 & (particle->color >>24);
	vis->pic = NULL;
	vis->bIsVoxel = false;
	vis->renderflags = particle->trans;
	vis->FakeFlatStat = fakeside;
	vis->floorclip = 0;
	vis->ColormapNum = 0;

	if (fixedlightlev >= 0)
	{
		vis->Style.colormap = map + fixedlightlev;
	}
	else if (fixedcolormap)
	{
		vis->Style.colormap = fixedcolormap;
	}
	else if (particle->bright)
	{
		vis->Style.colormap = map;
	}
	else
	{
		// Particles are slightly more visible than regular sprites.
		vis->ColormapNum = GETPALOOKUP(tiz * r_SpriteVisibility * 0.5, shade);
		vis->Style.colormap = map + (vis->ColormapNum << COLORMAPSHIFT);
	}
}